

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<long_long>::resize(QList<long_long> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<long_long> *in_RSI;
  QArrayDataPointer<long_long> *in_RDI;
  QList<long_long> *unaff_retaddr;
  QArrayDataPointer<long_long> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<long_long>::size((QList<long_long> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<long_long>::operator->(in_RDI);
    QArrayDataPointer<long_long>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }